

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

void __thiscall pbrt::FilmBase::FilmBase(FilmBase *this,FilmBaseParameters *p)

{
  pointer pcVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  int vb;
  int va;
  undefined4 uStack_3c;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> =
       (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  TVar2 = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> =
       (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar2;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = 0;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (p->filter).
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  this->diagonal = p->diagonal * 0.001;
  this->sensor = p->sensor;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (p->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + (p->filename)._M_string_length);
  va = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  if (((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x <= va) ||
     ((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y <=
      (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y)) {
    LogFatal<char_const(&)[23]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
               ,0xb7,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
  }
  vb = 0;
  if (va < 0) {
    LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
               ,0xb8,"Check failed: %s >= %s with %s = %s, %s = %s",
               (char (*) [19])"pixelBounds.pMin.x",(char (*) [2])0x5e8297,
               (char (*) [19])"pixelBounds.pMin.x",&va,(char (*) [2])0x5e8297,&vb);
  }
  va = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
  vb = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
  if (va <= vb) {
    va = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    vb = 0;
    if (va < 0) {
      LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                 ,0xba,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [19])"pixelBounds.pMin.y",(char (*) [2])0x5e8297,
                 (char (*) [19])"pixelBounds.pMin.y",&va,(char (*) [2])0x5e8297,&vb);
    }
    va = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    vb = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
    if (va <= vb) {
      if (LOGGING_LogLevel < 1) {
        local_38 = 0;
        local_30._M_local_buf[0] = '\0';
        _va = (pointer)&local_30;
        detail::stringPrintfRecursive<pbrt::Point2<int>&,pbrt::Bounds2<int>&>
                  ((string *)&va,"Created film with full resolution %s, pixelBounds %s",
                   &this->fullResolution,&this->pixelBounds);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
            ,0xbd,_va);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_va != &local_30) {
          operator_delete(_va,CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]
                                      ) + 1);
        }
      }
      return;
    }
    LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
               ,0xbb,"Check failed: %s <= %s with %s = %s, %s = %s",
               (char (*) [19])"pixelBounds.pMax.y",(char (*) [17])"fullResolution.y",
               (char (*) [19])"pixelBounds.pMax.y",&va,(char (*) [17])"fullResolution.y",&vb);
  }
  LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
             ,0xb9,"Check failed: %s <= %s with %s = %s, %s = %s",
             (char (*) [19])"pixelBounds.pMax.x",(char (*) [17])"fullResolution.x",
             (char (*) [19])"pixelBounds.pMax.x",&va,(char (*) [17])"fullResolution.x",&vb);
}

Assistant:

FilmBase(FilmBaseParameters p)
        : fullResolution(p.fullResolution),
          pixelBounds(p.pixelBounds),
          filter(p.filter),
          diagonal(p.diagonal * .001f),
          sensor(p.sensor),
          filename(p.filename) {
        CHECK(!pixelBounds.IsEmpty());
        CHECK_GE(pixelBounds.pMin.x, 0);
        CHECK_LE(pixelBounds.pMax.x, fullResolution.x);
        CHECK_GE(pixelBounds.pMin.y, 0);
        CHECK_LE(pixelBounds.pMax.y, fullResolution.y);
        LOG_VERBOSE("Created film with full resolution %s, pixelBounds %s",
                    fullResolution, pixelBounds);
    }